

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

int cmcmd::VisualStudioLinkIncremental
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,int type,bool verbose)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int mtRet;
  string manifestFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mtCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcCommand;
  string resourceInputFile;
  string targetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCommand;
  string outArg;
  string outputOpt;
  string tempManifest;
  string manifestArg;
  string fullPath;
  string resourceFile;
  ofstream fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  string local_598;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_558;
  value_type local_538;
  string local_518;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  value_type local_4d8;
  value_type local_4b8;
  value_type local_498;
  value_type local_478;
  string local_458;
  undefined1 local_438 [8];
  pointer pbStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [14];
  ios_base local_340 [272];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_4f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_518._M_string_length = 0;
  local_518.field_2._M_local_buf[0] = '\0';
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  iVar3 = ParseVisualStudioLinkCommand(args,&local_4f8,&local_518);
  if (iVar3 == -1) {
    iVar3 = -1;
  }
  else {
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"/MANIFESTFILE:","");
    local_558.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_558.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_558.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428[0]._M_allocated_capacity = (pointer)0x0;
    local_438 = (undefined1  [8])0x0;
    pbStack_430 = (pointer)0x0;
    cmsys::SystemTools::FindProgram
              ((string *)local_230,"rc.exe",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_438,false);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438);
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428[0]._M_allocated_capacity = (pointer)0x0;
    local_438 = (undefined1  [8])0x0;
    pbStack_430 = (pointer)0x0;
    cmsys::SystemTools::FindProgram
              ((string *)local_230,"mt.exe",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_438,false);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_578,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438);
    local_498._M_string_length = 0;
    local_498.field_2._M_local_buf[0] = '\0';
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_assign((string *)&local_498);
    std::__cxx11::string::append((char *)&local_498);
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_538,local_518._M_dataplus._M_p,
               local_518._M_dataplus._M_p + local_518._M_string_length);
    std::__cxx11::string::append((char *)&local_538);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Create ",7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_538._M_dataplus._M_p,
                          local_538._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    std::ofstream::ofstream(local_230,local_538._M_dataplus._M_p,_S_out);
    iVar3 = -1;
    if ((abStack_210[*(long *)(local_230._0_8_ + -0x18)] & 5) == 0) {
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,local_518._M_dataplus._M_p,
                 local_518._M_dataplus._M_p + local_518._M_string_length);
      std::__cxx11::string::append((char *)&local_598);
      cmsys::SystemTools::CollapseFullPath(&local_458,&local_598);
      poVar4 = (ostream *)std::ostream::operator<<(local_230,type);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ 24 /* RT_MANIFEST */ ",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_458._M_dataplus._M_p,local_458._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      std::ofstream::close();
      std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_498._M_dataplus._M_p);
      local_438 = (undefined1  [8])local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"/MANIFEST","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438,(ulong)(local_428[0]._M_allocated_capacity + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4f8,&local_478);
      bVar2 = cmsys::SystemTools::FileExists(local_598._M_dataplus._M_p);
      if (!bVar2) {
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Create empty: ",0xe);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_598._M_dataplus._M_p,
                              local_598._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        }
        std::ofstream::ofstream(local_438,local_598._M_dataplus._M_p,_S_out);
        local_438 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_438 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>
        ;
        std::filebuf::~filebuf((filebuf *)&pbStack_430);
        std::ios_base::~ios_base(local_340);
      }
      local_438 = (undefined1  [8])local_428;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_438,local_598._M_dataplus._M_p,
                 local_598._M_dataplus._M_p + local_598._M_string_length);
      std::__cxx11::string::append(local_438);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4f8,(value_type *)local_438);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"/fo","");
      std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_438);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_558,&local_4b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_558,&local_538);
      bVar2 = RunCommand("RC Pass 1",&local_558,verbose,(int *)0x0);
      iVar3 = -1;
      if (bVar2) {
        bVar2 = RunCommand("LINK Pass 1",&local_4f8,verbose,(int *)0x0);
        if (bVar2) {
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"/out:","");
          std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_598._M_dataplus._M_p);
          paVar1 = &local_5b8.field_2;
          local_5b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"/nologo","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_578
                     ,&local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_578,&local_4d8);
          local_5b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"/notify_update","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_578
                     ,&local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          local_5b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"/manifest","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_578
                     ,&local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_578,&local_498);
          local_5b8._M_dataplus._M_p = local_5b8._M_dataplus._M_p & 0xffffffff00000000;
          RunCommand("MT",&local_578,verbose,(int *)&local_5b8);
          if (((int)local_5b8._M_dataplus._M_p == 0xbb) ||
             (iVar3 = (int)local_5b8._M_dataplus._M_p, (int)local_5b8._M_dataplus._M_p == 0x41020001
             )) {
            bVar2 = RunCommand("RC Pass 2",&local_558,verbose,(int *)0x0);
            iVar3 = -1;
            if (bVar2) {
              bVar2 = RunCommand("FINAL LINK",&local_4f8,verbose,(int *)0x0);
              iVar3 = bVar2 - 1;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if (local_438 != (undefined1  [8])local_428) {
        operator_delete((void *)local_438,(ulong)(local_428[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,
                      CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                               local_498.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_578);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_558);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,
                    CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                             local_518.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4f8);
  return iVar3;
}

Assistant:

int cmcmd::VisualStudioLinkIncremental(std::vector<std::string>& args,
                                       int type, bool verbose)
{
  // This follows the steps listed here:
  // http://blogs.msdn.com/zakramer/archive/2006/05/22/603558.aspx

  //    1.  Compiler compiles the application and generates the *.obj files.
  //    2.  An empty manifest file is generated if this is a clean build and if
  //    not the previous one is reused.
  //    3.  The resource compiler (rc.exe) compiles the *.manifest file to a
  //    *.res file.
  //    4.  Linker generates the binary (EXE or DLL) with the /incremental
  //    switch and embeds the dummy manifest file. The linker also generates
  //    the real manifest file based on the binaries that your binary depends
  //    on.
  //    5.  The manifest tool (mt.exe) is then used to generate the final
  //    manifest.

  // If the final manifest is changed, then 6 and 7 are run, if not
  // they are skipped, and it is done.

  //    6.  The resource compiler is invoked one more time.
  //    7.  Finally, the Linker does another incremental link, but since the
  //    only thing that has changed is the *.res file that contains the
  //    manifest it is a short link.
  std::vector<std::string> linkCommand;
  std::string targetName;
  if(cmcmd::ParseVisualStudioLinkCommand(args, linkCommand, targetName) == -1)
    {
    return -1;
    }
  std::string manifestArg = "/MANIFESTFILE:";
  std::vector<std::string> rcCommand;
  rcCommand.push_back(cmSystemTools::FindProgram("rc.exe"));
  std::vector<std::string> mtCommand;
  mtCommand.push_back(cmSystemTools::FindProgram("mt.exe"));
  std::string tempManifest;
  tempManifest = targetName;
  tempManifest += ".intermediate.manifest";
  std::string resourceInputFile = targetName;
  resourceInputFile += ".resource.txt";
  if(verbose)
    {
    std::cout << "Create " << resourceInputFile << "\n";
    }
  // Create input file for rc command
  cmsys::ofstream fout(resourceInputFile.c_str());
  if(!fout)
    {
    return -1;
    }
  std::string manifestFile = targetName;
  manifestFile += ".embed.manifest";
  std::string fullPath= cmSystemTools::CollapseFullPath(manifestFile);
  fout << type << " /* CREATEPROCESS_MANIFEST_RESOURCE_ID "
    "*/ 24 /* RT_MANIFEST */ " << "\"" << fullPath << "\"";
  fout.close();
  manifestArg += tempManifest;
  // add the manifest arg to the linkCommand
  linkCommand.push_back("/MANIFEST");
  linkCommand.push_back(manifestArg);
  // if manifestFile is not yet created, create an
  // empty one
  if(!cmSystemTools::FileExists(manifestFile.c_str()))
    {
    if(verbose)
      {
      std::cout << "Create empty: " << manifestFile << "\n";
      }
    cmsys::ofstream foutTmp(manifestFile.c_str());
    }
  std::string resourceFile = manifestFile;
  resourceFile += ".res";
  // add the resource file to the end of the link command
  linkCommand.push_back(resourceFile);
  std::string outputOpt = "/fo";
  outputOpt += resourceFile;
  rcCommand.push_back(outputOpt);
  rcCommand.push_back(resourceInputFile);
  // Run rc command to create resource
  if(!cmcmd::RunCommand("RC Pass 1", rcCommand, verbose))
    {
    return -1;
    }
  // Now run the link command to link and create manifest
  if(!cmcmd::RunCommand("LINK Pass 1", linkCommand, verbose))
    {
    return -1;
    }
  // create mt command
  std::string outArg("/out:");
  outArg+= manifestFile;
  mtCommand.push_back("/nologo");
  mtCommand.push_back(outArg);
  mtCommand.push_back("/notify_update");
  mtCommand.push_back("/manifest");
  mtCommand.push_back(tempManifest);
  //  now run mt.exe to create the final manifest file
  int mtRet =0;
  cmcmd::RunCommand("MT", mtCommand, verbose, &mtRet);
  // if mt returns 0, then the manifest was not changed and
  // we do not need to do another link step
  if(mtRet == 0)
    {
    return 0;
    }
  // check for magic mt return value if mt returns the magic number
  // 1090650113 then it means that it updated the manifest file and we need
  // to do the final link.  If mt has any value other than 0 or 1090650113
  // then there was some problem with the command itself and there was an
  // error so return the error code back out of cmake so make can report it.
  // (when hosted on a posix system the value is 187)
  if(mtRet != 1090650113 && mtRet != 187)
    {
    return mtRet;
    }
  // update the resource file with the new manifest from the mt command.
  if(!cmcmd::RunCommand("RC Pass 2", rcCommand, verbose))
    {
    return -1;
    }
  // Run the final incremental link that will put the new manifest resource
  // into the file incrementally.
  if(!cmcmd::RunCommand("FINAL LINK", linkCommand, verbose))
    {
    return -1;
    }
  return 0;
}